

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

void __thiscall
cppjieba::Trie::Find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *res,size_t max_word_len)

{
  const_iterator pRVar1;
  pointer pDVar2;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *pvVar6;
  iterator iVar7;
  ulong uVar8;
  size_type sVar9;
  const_iterator __k;
  ulong uVar10;
  undefined8 *puVar11;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_70;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *local_60;
  size_type local_58;
  const_iterator local_50;
  Trie *local_48;
  const_iterator local_40;
  size_t local_38;
  
  local_48 = this;
  local_38 = max_word_len;
  if (this->root_ == (TrieNode *)0x0) {
    __assert_fail("root_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/Trie.hpp"
                  ,0x55,
                  "void cppjieba::Trie::Find(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<struct Dag> &, size_t) const"
                 );
  }
  local_58 = ((long)end - (long)begin) / 0x14;
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::resize(res,local_58);
  __k = begin + 1;
  sVar9 = 0;
  local_60 = res;
  local_50 = begin;
  do {
    pvVar6 = local_60;
    if (sVar9 == local_58) {
      return;
    }
    pDVar2 = (local_60->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pDVar2[sVar9].runestr.unicode_length = local_50[sVar9].unicode_length;
    pRVar1 = local_50 + sVar9;
    uVar3 = pRVar1->offset;
    uVar4 = pRVar1->len;
    uVar5 = pRVar1->unicode_offset;
    pDVar2 = pDVar2 + sVar9;
    (pDVar2->runestr).rune = pRVar1->rune;
    (pDVar2->runestr).offset = uVar3;
    (pDVar2->runestr).len = uVar4;
    (pDVar2->runestr).unicode_offset = uVar5;
    this_00 = &local_48->root_->next->_M_h;
    if (this_00 ==
        (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) {
LAB_00109be1:
      local_70.second = (DictUnit *)0x0;
      local_70.first = sVar9;
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                (&(pvVar6->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                  _M_impl.super__Vector_impl_data._M_start[sVar9].nexts,&local_70);
      puVar11 = (undefined8 *)0x0;
    }
    else {
      iVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_00,(key_type *)
                             ((local_60->
                              super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                              _M_impl.super__Vector_impl_data._M_start + sVar9));
      if ((iVar7.
           super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
           _M_cur == (__node_type *)0x0) ||
         (puVar11 = *(undefined8 **)
                     ((long)iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                            ._M_cur + 0x10), puVar11 == (undefined8 *)0x0)) goto LAB_00109be1;
      local_70.second = (DictUnit *)puVar11[1];
      local_70.first = sVar9;
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                (&(pvVar6->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                  _M_impl.super__Vector_impl_data._M_start[sVar9].nexts,&local_70);
    }
    uVar8 = 2;
    local_40 = __k;
    while ((((uVar10 = (uVar8 + sVar9) - 1, uVar10 < local_58 && (puVar11 != (undefined8 *)0x0)) &&
            (uVar8 <= local_38)) &&
           ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)*puVar11 !=
            (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)0x0))) {
      iVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)*puVar11,&__k->rune);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
          _M_cur == (__node_type *)0x0) break;
      puVar11 = *(undefined8 **)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                        ._M_cur + 0x10);
      if ((DictUnit *)puVar11[1] != (DictUnit *)0x0) {
        local_70.first = uVar10;
        local_70.second = (DictUnit *)puVar11[1];
        limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                  (&(local_60->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                    _M_impl.super__Vector_impl_data._M_start[sVar9].nexts,&local_70);
      }
      uVar8 = uVar8 + 1;
      __k = __k + 1;
    }
    sVar9 = sVar9 + 1;
    __k = local_40 + 1;
  } while( true );
}

Assistant:

void Find(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<struct Dag>&res, 
        size_t max_word_len = MAX_WORD_LENGTH) const {
    assert(root_ != NULL);
    res.resize(end - begin);

    const TrieNode *ptNode = NULL;
    TrieNode::NextMap::const_iterator citer;
    for (size_t i = 0; i < size_t(end - begin); i++) {
      res[i].runestr = *(begin + i);

      if (root_->next != NULL && root_->next->end() != (citer = root_->next->find(res[i].runestr.rune))) {
        ptNode = citer->second;
      } else {
        ptNode = NULL;
      }
      if (ptNode != NULL) {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, ptNode->ptValue));
      } else {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, static_cast<const DictUnit*>(NULL)));
      }

      for (size_t j = i + 1; j < size_t(end - begin) && (j - i + 1) <= max_word_len; j++) {
        if (ptNode == NULL || ptNode->next == NULL) {
          break;
        }
        citer = ptNode->next->find((begin + j)->rune);
        if (ptNode->next->end() == citer) {
          break;
        }
        ptNode = citer->second;
        if (NULL != ptNode->ptValue) {
          res[i].nexts.push_back(pair<size_t, const DictUnit*>(j, ptNode->ptValue));
        }
      }
    }
  }